

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar5 = (int)CONCAT62(in_register_0000003a,op);
  uVar4 = iVar5 - 0x11f;
  if (uVar4 < 0x2e) {
    reader = (ByteCodeReader *)0x3cc800000000;
    if ((0x3cc800000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      reader = (ByteCodeReader *)0x28200003;
      if ((0x28200003UL >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_0075171e;
      goto LAB_00751705;
    }
  }
  else {
LAB_0075171e:
    if (iVar5 - 0xd6U < 3) {
      this = ParseableFunctionInfo::GetNestedFunctionProxy
                       (&dumpFunction->super_ParseableFunctionInfo,data->SlotIndex);
      uVar4 = data->Value;
      pPVar6 = FunctionProxy::EnsureDeserialized(this);
      iVar5 = (*(pPVar6->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(pPVar6);
      Output::Print(L" R%d = %s()",(ulong)uVar4,CONCAT44(extraout_var,iVar5));
      return;
    }
    if (iVar5 == 0x92) {
LAB_00751705:
      uVar1 = data->SlotIndex;
      uVar4 = data->Value;
      form = L" R%d = [%d] ";
      goto LAB_00751711;
    }
    if (iVar5 != 0x96) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x395,"(false)","Unknown OpCode for OpLayoutElementSlotI1");
      if (bVar3) {
        *puVar7 = 0;
        return;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  uVar4 = data->SlotIndex;
  uVar1 = data->Value;
  form = L" [%d] = R%d ";
LAB_00751711:
  Output::Print(form,(ulong)uVar4,(ulong)uVar1,reader);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlotI1(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::StLocalSlot:
            case OpCode::StParamSlot:
            case OpCode::StLocalObjSlot:
            case OpCode::StParamObjSlot:
            case OpCode::StLocalSlotChkUndecl:
            case OpCode::StParamSlotChkUndecl:
            case OpCode::StLocalObjSlotChkUndecl:
            case OpCode::StParamObjSlotChkUndecl:
                Output::Print(_u(" [%d] = R%d "),data->SlotIndex, data->Value);
                break;
            case OpCode::LdLocalSlot:
            case OpCode::LdParamSlot:
            case OpCode::LdEnvObj:
            case OpCode::LdEnvObj_ReuseLoc:
            case OpCode::LdLocalObjSlot:
            case OpCode::LdParamObjSlot:
                Output::Print(_u(" R%d = [%d] "), data->Value, data->SlotIndex);
                break;
            case OpCode::NewScFunc:
            case OpCode::NewStackScFunc:
            case OpCode::NewScGenFunc:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = %s()"), data->Value,
                        pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlotI1");
                break;
            }
        }
    }